

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

void Gia_ManAreFree(Gia_ManAre_t *p)

{
  uint **__ptr;
  uint *__ptr_00;
  long lVar1;
  
  Gia_ManStop(p->pAig);
  if (p->pNew != (Gia_Man_t *)0x0) {
    Gia_ManStop(p->pNew);
  }
  Vec_IntFree(p->vCubesA);
  Vec_IntFree(p->vCubesB);
  Vec_VecFree(p->vCiTfos);
  Vec_VecFree(p->vCiLits);
  for (lVar1 = 0; __ptr = p->ppObjs, lVar1 < p->nObjPages; lVar1 = lVar1 + 1) {
    if (__ptr[lVar1] != (uint *)0x0) {
      free(__ptr[lVar1]);
      p->ppObjs[lVar1] = (uint *)0x0;
    }
  }
  if (__ptr != (uint **)0x0) {
    free(__ptr);
    p->ppObjs = (uint **)0x0;
  }
  for (lVar1 = 0; lVar1 < p->nStaPages; lVar1 = lVar1 + 1) {
    __ptr_00 = p->ppStas[lVar1];
    if (__ptr_00 != (uint *)0x0) {
      free(__ptr_00);
      p->ppStas[lVar1] = (uint *)0x0;
    }
  }
  free(p->ppStas);
  free(p);
  return;
}

Assistant:

void Gia_ManAreFree( Gia_ManAre_t * p )
{
    int i;
    Gia_ManStop( p->pAig );
    if ( p->pNew )
        Gia_ManStop( p->pNew );
    Vec_IntFree( p->vCubesA );
    Vec_IntFree( p->vCubesB );
    Vec_VecFree( p->vCiTfos );
    Vec_VecFree( p->vCiLits );
    for ( i = 0; i < p->nObjPages; i++ )
        ABC_FREE( p->ppObjs[i] );
    ABC_FREE( p->ppObjs );
    for ( i = 0; i < p->nStaPages; i++ )
        ABC_FREE( p->ppStas[i] );
    ABC_FREE( p->ppStas );
//    ABC_FREE( p->pfUseless );
    ABC_FREE( p );
}